

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zueci.c
# Opt level: O2

int zueci_dest_len_utf8(int eci,uchar *src,int src_len,uint replacement_char,uint flags,
                       int *p_dest_len)

{
  byte *pbVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  zueci_u32 len;
  int iVar5;
  byte *pbVar6;
  int local_5c;
  zueci_u32 u;
  uint state;
  ulong local_50;
  int *local_48;
  zueci_utf8_func_t local_40;
  uchar replacement [5];
  
  iVar2 = zueci_is_valid_eci(eci);
  if (iVar2 == 0) {
    iVar2 = 7;
  }
  else {
    iVar2 = 8;
    if (p_dest_len != (int *)0x0 && src != (uchar *)0x0) {
      pbVar6 = src + src_len;
      if ((eci == 899) ||
         (((flags & 1) != 0 &&
          ((((uint)eci < 0x1c && ((0x800000aU >> (eci & 0x1fU) & 1) != 0)) || (eci == 0xaa)))))) {
        iVar2 = 0;
        for (; src < pbVar6; src = src + 1) {
          iVar2 = iVar2 + (uint)(*src >> 7) + 1;
        }
        *p_dest_len = iVar2;
        iVar2 = 0;
      }
      else {
        local_50 = (ulong)replacement_char;
        if (replacement_char == 0) {
          local_5c = 0;
        }
        else {
          if (0xd7ff < replacement_char && replacement_char - 0x10000 < 0xffffe000) {
            return 8;
          }
          local_5c = zueci_encode_utf8(replacement_char,replacement);
        }
        if ((eci & 0xfffffffdU) == 1) {
          iVar3 = 0;
          iVar2 = 0;
          for (; src < pbVar6; src = src + 1) {
            if ((char)*src < -0x60) {
              iVar2 = 1;
              iVar5 = local_5c;
              if ((int)local_50 == 0) {
                return 6;
              }
            }
            else {
              iVar5 = (*src >> 7) + 1;
            }
            iVar3 = iVar3 + iVar5;
          }
          *p_dest_len = iVar3;
        }
        else {
          local_48 = p_dest_len;
          if (eci == 0xaa) {
            local_40 = zueci_ascii_inv_u;
          }
          else {
            if (eci == 0x1a) {
              state = 0;
              iVar3 = 0;
              iVar2 = 0;
              do {
                pbVar1 = src;
                if (pbVar6 <= src) {
                  *local_48 = iVar3;
                  return iVar2;
                }
                do {
                  src = pbVar1;
                  zueci_decode_utf8(&state,&u,*src);
                  if (pbVar6 <= src + 1) {
                    if (state == 0) {
LAB_00198e05:
                      iVar5 = (((uint)(0x7f < u) - (uint)(u < 0x800)) - (uint)(u < 0x10000)) + 3;
                      src = src + 1;
                      goto LAB_00198e2c;
                    }
                    break;
                  }
                  if (state == 0) goto LAB_00198e05;
                  pbVar1 = src + 1;
                } while (state != 0xc);
                if ((int)local_50 == 0) {
                  return 9;
                }
                if ((char)*src < '\0') {
                  src = src + 1;
                }
                state = 0;
                iVar2 = 1;
                iVar5 = local_5c;
LAB_00198e2c:
                iVar3 = iVar3 + iVar5;
              } while( true );
            }
            local_40 = zueci_utf8_funcs[eci];
          }
          iVar3 = 0;
          iVar2 = 0;
          for (; src < pbVar6; src = src + iVar5) {
            len = (int)pbVar6 - (int)src;
            iVar5 = (*local_40)(src,len,flags,&u);
            if (iVar5 == 0) {
              if ((int)local_50 == 0) {
                return 6;
              }
              iVar5 = zueci_replacement_incr(eci,src,len);
              iVar2 = 1;
              iVar4 = local_5c;
            }
            else {
              iVar4 = (((uint)(0x7f < u) - (uint)(u < 0x800)) - (uint)(u < 0x10000)) + 3;
            }
            iVar3 = iVar3 + iVar4;
          }
          *local_48 = iVar3;
        }
      }
    }
  }
  return iVar2;
}

Assistant:

ZUECI_EXTERN int zueci_dest_len_utf8(const int eci, const unsigned char src[], const int src_len,
                const unsigned int replacement_char, const int unsigned flags, int *p_dest_len) {
    const unsigned char *s = src;
    const unsigned char *const se = src + src_len;
    zueci_utf8_func_t utf8_func;
    zueci_u32 u;
    int src_incr;
    unsigned char replacement[5];
    int replacement_len = 0; /* g++ complains with "-Wmaybe-uninitialized" if this isn't set */
    int dest_len = 0;
    int ret = 0;

    /* NOTE: the following is "unrolled" from `zueci_eci_to_utf8()` and should be the same except for the copying */

    if (!zueci_is_valid_eci(eci)) {
        return ZUECI_ERROR_INVALID_ECI;
    }
    if (!src || !p_dest_len) {
        return ZUECI_ERROR_INVALID_ARGS;
    }

    /* Special case Binary, and if straight-thru flag set then ISO/IEC 8859-1, ASCII and ISO/IEC 646 Invariant also */
    if (eci == 899 || ((flags & ZUECI_FLAG_SB_STRAIGHT_THRU) && (eci == 1 || eci == 3 || eci == 27 || eci == 170))) {
        while (s < se) {
            dest_len += 1 + (*s++ >= 0x80);
        }
        *p_dest_len = dest_len;
        return 0;
    }

    if (replacement_char) {
        if (!ZUECI_IS_VALID_UNICODE(replacement_char) || replacement_char > 0xFFFF) { /* Allow BMP only */
            return ZUECI_ERROR_INVALID_ARGS;
        }
        replacement_len = zueci_encode_utf8(replacement_char, replacement);
    }

    /* Special case ISO/IEC 8859-1 */
    if (eci == 1 || eci == 3) {
        for (; s < se; s++) {
            if (*s >= 0x80 && *s < 0xA0) {
                if (!replacement_char) {
                    return ZUECI_ERROR_INVALID_DATA;
                }
                dest_len += replacement_len;
                ret = ZUECI_WARN_INVALID_DATA;
            } else {
                dest_len += 1 + (*s >= 0x80);
            }
        }
        *p_dest_len = dest_len;
        return ret;
    }

    /* Special case UTF-8 */
    if (eci == 26) {
        unsigned int state = 0;
        while (s < se) {
            do {
                zueci_decode_utf8(&state, &u, *s++);
            } while (s < se && state != 0 && state != 12);
            if (state != 0) {
                if (!replacement_char) {
                    return ZUECI_ERROR_INVALID_UTF8;
                }
                if (*(s - 1) < 0x80) { /* If previous ASCII, backtrack */
                    s--;
                } else {
                    while (s < se && (*s & 0xC0) == 0x80) { /* Skip any continuation bytes */
                        s++;
                    }
                }
                dest_len += replacement_len;
                ret = ZUECI_WARN_INVALID_DATA;
                state = 0;
            } else {
                dest_len += 1 + (u >= 0x80) + (u >= 0x800) + (u >= 0x10000);
            }
        }
        *p_dest_len = dest_len;
        return ret;
    }

    if (eci == 170) {
        utf8_func = zueci_ascii_inv_u;
    } else {
        utf8_func = zueci_utf8_funcs[eci];
    }

    while (s < se) {
        if (!(src_incr = (*utf8_func)(s, (int) (se - s), flags, &u))) {
            if (!replacement_char) {
                return ZUECI_ERROR_INVALID_DATA;
            }
            s += zueci_replacement_incr(eci, s, (int) (se - s));
            dest_len += replacement_len;
            ret = ZUECI_WARN_INVALID_DATA;
        } else {
            s += src_incr;
            dest_len += 1 + (u >= 0x80) + (u >= 0x800) + (u >= 0x10000);
        }
    }
    *p_dest_len = dest_len;
    return ret;
}